

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# q20utility.h
# Opt level: O0

bool q20::cmp_equal<unsigned_int,int>(uint t,int u)

{
  int in_ESI;
  int in_EDI;
  bool local_9;
  
  detail::checkTypeCompatibility<unsigned_int,int>();
  local_9 = -1 < in_ESI && in_EDI == in_ESI;
  return local_9;
}

Assistant:

constexpr bool cmp_equal(T t, U u) noexcept
{
    // Both T and U are standard integer types or extended integer types
    // https://eel.is/c++draft/utility.intcmp#1
    detail::checkTypeCompatibility<T, U>();
    // See https://eel.is/c++draft/utility.intcmp#2
    using UT = std::make_unsigned_t<T>;
    using UU = std::make_unsigned_t<U>;
    if constexpr (std::is_signed_v<T> == std::is_signed_v<U>)
        return t == u;
    else if constexpr (std::is_signed_v<T>)
        return t < 0 ? false : UT(t) == u;
    else
        return u < 0 ? false : t == UU(u);
}